

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 703_kthLargestElement.cpp
# Opt level: O3

void __thiscall
KthLargest::KthLargest(KthLargest *this,int k,vector<int,_std::allocator<int>_> *nums)

{
  int *piVar1;
  int *piVar2;
  
  this->k = k;
  (this->pq).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pq).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->pq).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar1 = (nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar2 = (nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    add(this,*piVar2);
  }
  return;
}

Assistant:

KthLargest(int k, vector<int>& nums) : k(k) {
        for (int n : nums)
            add(n);
    }